

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  BVH *bvh;
  NodeRef root;
  Scene *pSVar2;
  float *pfVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  size_t k;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  vfloat<4> vVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  uint uVar16;
  ulong uVar17;
  RTCRayN *pRVar18;
  ulong uVar19;
  int iVar20;
  undefined4 uVar21;
  int iVar22;
  RTCIntersectArguments *pRVar23;
  Intersectors *pIVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar28;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar29;
  long lVar30;
  ulong uVar31;
  NodeRef *pNVar32;
  bool bVar33;
  float fVar34;
  float fVar48;
  float fVar49;
  vint4 bi_1;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar50;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar47;
  float fVar51;
  float fVar61;
  float fVar62;
  vint4 bi;
  undefined1 auVar52 [16];
  float fVar63;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar64;
  float fVar72;
  float fVar73;
  vint4 ai;
  float fVar74;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar75;
  float fVar78;
  float fVar79;
  vint4 ai_1;
  undefined1 auVar76 [16];
  float fVar80;
  undefined1 auVar77 [16];
  float fVar81;
  float fVar85;
  float fVar86;
  vint4 ai_3;
  float fVar87;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  uint uVar92;
  uint uVar93;
  vint4 bi_2;
  undefined1 auVar88 [16];
  uint uVar94;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar95;
  float fVar96;
  float fVar98;
  float fVar100;
  vint4 bi_3;
  float fVar99;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar97 [16];
  uint uVar104;
  float fVar105;
  uint uVar110;
  uint uVar112;
  vint4 ai_2;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar111;
  float fVar113;
  uint uVar114;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar115;
  float fVar116;
  uint uVar117;
  float fVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar121;
  uint uVar122;
  float fVar123;
  uint uVar128;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  uint uVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  TravRayK<4,_false> *tray_00;
  float local_19f8;
  float fStack_19f4;
  float fStack_19f0;
  float fStack_19ec;
  Precalculations pre;
  undefined1 local_1988 [16];
  undefined1 local_1978 [8];
  float fStack_1970;
  float fStack_196c;
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  IntersectFunc4 p_Stack_18d0;
  OccludedFunc8 local_1898;
  IntersectFunc4 p_Stack_1890;
  undefined1 local_1888 [16];
  float local_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  undefined1 local_1868 [16];
  undefined1 local_1858 [16];
  undefined1 local_1848 [16];
  uint local_1838;
  uint uStack_1834;
  uint uStack_1830;
  uint uStack_182c;
  uint local_1828;
  uint uStack_1824;
  uint uStack_1820;
  uint uStack_181c;
  uint local_1818;
  uint uStack_1814;
  uint uStack_1810;
  uint uStack_180c;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar124 [16];
  
  auVar60 = mm_lookupmask_ps._240_16_;
  uVar15 = mm_lookupmask_ps._8_8_;
  uVar14 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    pRVar23 = (RTCIntersectArguments *)context;
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       (pRVar23 = context->args, ((ulong)*(Scene **)&pRVar23->flags & 0x10000) != 0)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar44._8_4_ = 0xffffffff;
    auVar44._0_8_ = 0xffffffffffffffff;
    auVar44._12_4_ = 0xffffffff;
    auVar54 = *(undefined1 (*) [16])(ray + 0x80);
    auVar76._0_12_ = ZEXT812(0);
    auVar76._12_4_ = 0;
    uVar122 = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar54._0_4_);
    uVar128 = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar54._4_4_);
    auVar124._0_8_ = CONCAT44(uVar128,uVar122);
    auVar124._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar54._8_4_);
    auVar124._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar54._12_4_);
    iVar20 = movmskps((int)pRVar23,auVar124);
    if (iVar20 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar95 = (float)DAT_01ff1d40;
      fVar98 = DAT_01ff1d40._4_4_;
      fVar100 = DAT_01ff1d40._8_4_;
      fVar102 = DAT_01ff1d40._12_4_;
      auVar36._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < fVar98);
      auVar36._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < fVar95);
      auVar36._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < fVar100);
      auVar36._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < fVar102);
      auVar106 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01ff1d40,auVar36
                         );
      auVar52._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar98);
      auVar52._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar95);
      auVar52._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar100);
      auVar52._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar102);
      auVar52 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01ff1d40,auVar52)
      ;
      auVar35._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < fVar98);
      auVar35._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < fVar95);
      auVar35._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < fVar100);
      auVar35._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < fVar102);
      auVar88 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01ff1d40,auVar35)
      ;
      auVar36 = rcpps(auVar35,auVar106);
      fVar95 = auVar36._0_4_;
      auVar107._0_4_ = auVar106._0_4_ * fVar95;
      fVar98 = auVar36._4_4_;
      auVar107._4_4_ = auVar106._4_4_ * fVar98;
      fVar100 = auVar36._8_4_;
      auVar107._8_4_ = auVar106._8_4_ * fVar100;
      fVar102 = auVar36._12_4_;
      auVar107._12_4_ = auVar106._12_4_ * fVar102;
      tray.rdir.field_0._0_4_ = (1.0 - auVar107._0_4_) * fVar95 + fVar95;
      tray.rdir.field_0._4_4_ = (1.0 - auVar107._4_4_) * fVar98 + fVar98;
      tray.rdir.field_0._8_4_ = (1.0 - auVar107._8_4_) * fVar100 + fVar100;
      tray.rdir.field_0._12_4_ = (1.0 - auVar107._12_4_) * fVar102 + fVar102;
      auVar36 = rcpps(auVar107,auVar52);
      fVar95 = auVar36._0_4_;
      fVar98 = auVar36._4_4_;
      fVar100 = auVar36._8_4_;
      fVar102 = auVar36._12_4_;
      tray.rdir.field_0._16_4_ = (1.0 - auVar52._0_4_ * fVar95) * fVar95 + fVar95;
      tray.rdir.field_0._20_4_ = (1.0 - auVar52._4_4_ * fVar98) * fVar98 + fVar98;
      tray.rdir.field_0._24_4_ = (1.0 - auVar52._8_4_ * fVar100) * fVar100 + fVar100;
      tray.rdir.field_0._28_4_ = (1.0 - auVar52._12_4_ * fVar102) * fVar102 + fVar102;
      auVar36 = rcpps(auVar36,auVar88);
      fVar95 = auVar36._0_4_;
      fVar98 = auVar36._4_4_;
      fVar100 = auVar36._8_4_;
      fVar102 = auVar36._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar88._0_4_ * fVar95) * fVar95 + fVar95;
      tray.rdir.field_0._36_4_ = (1.0 - auVar88._4_4_ * fVar98) * fVar98 + fVar98;
      tray.rdir.field_0._40_4_ = (1.0 - auVar88._8_4_ * fVar100) * fVar100 + fVar100;
      tray.rdir.field_0._44_4_ = (1.0 - auVar88._12_4_ * fVar102) * fVar102 + fVar102;
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar88._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar88._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar88._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar88._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fed0,_DAT_01ffd210,auVar88);
      auVar106._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar106._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar106._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar106._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fef0,_DAT_0201fee0,auVar106);
      auVar36 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar76);
      auVar76 = maxps(auVar54,auVar76);
      fVar95 = (float)DAT_01feb9f0;
      fVar98 = DAT_01feb9f0._4_4_;
      fVar100 = DAT_01feb9f0._8_4_;
      fVar102 = DAT_01feb9f0._12_4_;
      auVar54._8_4_ = auVar124._8_4_;
      auVar54._0_8_ = auVar124._0_8_;
      auVar54._12_4_ = auVar124._12_4_;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01feb9f0,auVar36,auVar54);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01feba00,auVar76,auVar54);
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar44 ^ auVar124);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar27 = 3;
      }
      else {
        uVar27 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar32 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01feb9f0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      iVar20 = 0x224ff80;
      paVar28 = &stack_near[2].field_0;
LAB_00247181:
      paVar29 = paVar28 + -1;
      root.ptr = pNVar32[-1].ptr;
      pNVar32 = pNVar32 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_00248080;
      local_19f8 = paVar29->v[0];
      fStack_19f4 = *(float *)((long)paVar28 + -0xc);
      fStack_19f0 = *(float *)((long)paVar28 + -8);
      fStack_19ec = *(float *)((long)paVar28 + -4);
      vVar13.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar29->v;
      auVar37._4_4_ = -(uint)(fStack_19f4 < tray.tfar.field_0.v[1]);
      auVar37._0_4_ = -(uint)(local_19f8 < tray.tfar.field_0.v[0]);
      auVar37._8_4_ = -(uint)(fStack_19f0 < tray.tfar.field_0.v[2]);
      auVar37._12_4_ = -(uint)(fStack_19ec < tray.tfar.field_0.v[3]);
      uVar16 = movmskps(iVar20,auVar37);
      if (uVar16 == 0) {
LAB_00248091:
        iVar20 = 2;
      }
      else {
        uVar25 = (ulong)(uVar16 & 0xff);
        uVar16 = POPCOUNT(uVar16 & 0xff);
        iVar20 = 0;
        if (uVar16 <= uVar27) {
          do {
            k = 0;
            if (uVar25 != 0) {
              for (; (uVar25 >> k & 1) == 0; k = k + 1) {
              }
            }
            tray_00 = &tray;
            valid_i = (vint<4> *)This;
            bVar33 = occluded1(This,bvh,root,k,&pre,ray,tray_00,context);
            if (bVar33) {
              terminated.field_0.i[k] = -1;
            }
            uVar25 = uVar25 & uVar25 - 1;
          } while (uVar25 != 0);
          iVar22 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
          iVar20 = 3;
          fVar95 = INFINITY;
          fVar98 = INFINITY;
          fVar100 = INFINITY;
          fVar102 = INFINITY;
          local_19f8 = vVar13.field_0._0_4_;
          fStack_19f4 = vVar13.field_0._4_4_;
          fStack_19f0 = vVar13.field_0._8_4_;
          fStack_19ec = vVar13.field_0._12_4_;
          if (iVar22 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                          (undefined1  [16])terminated.field_0);
            iVar20 = 2;
          }
        }
        if (uVar27 < uVar16) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00248080;
              auVar40._4_4_ = -(uint)(fStack_19f4 < tray.tfar.field_0.v[1]);
              auVar40._0_4_ = -(uint)(local_19f8 < tray.tfar.field_0.v[0]);
              auVar40._8_4_ = -(uint)(fStack_19f0 < tray.tfar.field_0.v[2]);
              auVar40._12_4_ = -(uint)(fStack_19ec < tray.tfar.field_0.v[3]);
              iVar20 = movmskps(iVar20,auVar40);
              if (iVar20 == 0) goto LAB_00248091;
              uVar25 = (ulong)((uint)root.ptr & 0xf);
              aVar47 = terminated.field_0;
              if (uVar25 == 8) goto LAB_0024804b;
              auVar41._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              auVar41._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
              auVar41._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
              lVar30 = (root.ptr & 0xfffffffffffffff0) + 0x50;
              uVar19 = 0;
              goto LAB_002473cc;
            }
            pIVar24 = (Intersectors *)0x0;
            uVar25 = 8;
            local_19f8 = fVar95;
            fStack_19f4 = fVar98;
            fStack_19f0 = fVar100;
            fStack_19ec = fVar102;
            do {
              uVar19 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + (long)pIVar24 * 8);
              if (uVar19 != 8) {
                fVar103 = *(float *)(root.ptr + 0x20 + (long)pIVar24 * 4);
                fVar34 = *(float *)(root.ptr + 0x30 + (long)pIVar24 * 4);
                fVar48 = *(float *)(root.ptr + 0x40 + (long)pIVar24 * 4);
                fVar50 = *(float *)(root.ptr + 0x50 + (long)pIVar24 * 4);
                fVar64 = (fVar103 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
                fVar72 = (fVar103 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
                fVar73 = (fVar103 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
                fVar74 = (fVar103 - (float)tray.org.field_0._12_4_) *
                         (float)tray.rdir.field_0._12_4_;
                fVar75 = (fVar48 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_
                ;
                fVar78 = (fVar48 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_
                ;
                fVar79 = (fVar48 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_
                ;
                fVar80 = (fVar48 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_
                ;
                fVar103 = *(float *)(root.ptr + 0x60 + (long)pIVar24 * 4);
                fVar81 = (fVar103 - (float)tray.org.field_0._32_4_) *
                         (float)tray.rdir.field_0._32_4_;
                fVar85 = (fVar103 - (float)tray.org.field_0._36_4_) *
                         (float)tray.rdir.field_0._36_4_;
                fVar86 = (fVar103 - (float)tray.org.field_0._40_4_) *
                         (float)tray.rdir.field_0._40_4_;
                fVar87 = (fVar103 - (float)tray.org.field_0._44_4_) *
                         (float)tray.rdir.field_0._44_4_;
                fVar51 = (fVar34 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
                fVar61 = (fVar34 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
                fVar62 = (fVar34 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
                fVar63 = (fVar34 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_
                ;
                fVar34 = (fVar50 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_
                ;
                fVar48 = (fVar50 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_
                ;
                fVar49 = (fVar50 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_
                ;
                fVar50 = (fVar50 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_
                ;
                fVar103 = *(float *)(root.ptr + 0x70 + (long)pIVar24 * 4);
                fVar96 = (fVar103 - (float)tray.org.field_0._32_4_) *
                         (float)tray.rdir.field_0._32_4_;
                fVar99 = (fVar103 - (float)tray.org.field_0._36_4_) *
                         (float)tray.rdir.field_0._36_4_;
                fVar101 = (fVar103 - (float)tray.org.field_0._40_4_) *
                          (float)tray.rdir.field_0._40_4_;
                fVar103 = (fVar103 - (float)tray.org.field_0._44_4_) *
                          (float)tray.rdir.field_0._44_4_;
                uVar16 = (uint)((int)fVar51 < (int)fVar64) * (int)fVar51 |
                         (uint)((int)fVar51 >= (int)fVar64) * (int)fVar64;
                uVar92 = (uint)((int)fVar61 < (int)fVar72) * (int)fVar61 |
                         (uint)((int)fVar61 >= (int)fVar72) * (int)fVar72;
                uVar93 = (uint)((int)fVar62 < (int)fVar73) * (int)fVar62 |
                         (uint)((int)fVar62 >= (int)fVar73) * (int)fVar73;
                uVar94 = (uint)((int)fVar63 < (int)fVar74) * (int)fVar63 |
                         (uint)((int)fVar63 >= (int)fVar74) * (int)fVar74;
                uVar104 = (uint)((int)fVar34 < (int)fVar75) * (int)fVar34 |
                          (uint)((int)fVar34 >= (int)fVar75) * (int)fVar75;
                uVar110 = (uint)((int)fVar48 < (int)fVar78) * (int)fVar48 |
                          (uint)((int)fVar48 >= (int)fVar78) * (int)fVar78;
                uVar112 = (uint)((int)fVar49 < (int)fVar79) * (int)fVar49 |
                          (uint)((int)fVar49 >= (int)fVar79) * (int)fVar79;
                uVar114 = (uint)((int)fVar50 < (int)fVar80) * (int)fVar50 |
                          (uint)((int)fVar50 >= (int)fVar80) * (int)fVar80;
                uVar104 = ((int)uVar104 < (int)uVar16) * uVar16 |
                          ((int)uVar104 >= (int)uVar16) * uVar104;
                uVar110 = ((int)uVar110 < (int)uVar92) * uVar92 |
                          ((int)uVar110 >= (int)uVar92) * uVar110;
                uVar112 = ((int)uVar112 < (int)uVar93) * uVar93 |
                          ((int)uVar112 >= (int)uVar93) * uVar112;
                uVar114 = ((int)uVar114 < (int)uVar94) * uVar94 |
                          ((int)uVar114 >= (int)uVar94) * uVar114;
                uVar16 = (uint)((int)fVar96 < (int)fVar81) * (int)fVar96 |
                         (uint)((int)fVar96 >= (int)fVar81) * (int)fVar81;
                uVar92 = (uint)((int)fVar99 < (int)fVar85) * (int)fVar99 |
                         (uint)((int)fVar99 >= (int)fVar85) * (int)fVar85;
                uVar93 = (uint)((int)fVar101 < (int)fVar86) * (int)fVar101 |
                         (uint)((int)fVar101 >= (int)fVar86) * (int)fVar86;
                uVar94 = (uint)((int)fVar103 < (int)fVar87) * (int)fVar103 |
                         (uint)((int)fVar103 >= (int)fVar87) * (int)fVar87;
                auVar89._0_4_ =
                     ((int)uVar16 < (int)uVar104) * uVar104 | ((int)uVar16 >= (int)uVar104) * uVar16
                ;
                auVar89._4_4_ =
                     ((int)uVar92 < (int)uVar110) * uVar110 | ((int)uVar92 >= (int)uVar110) * uVar92
                ;
                auVar89._8_4_ =
                     ((int)uVar93 < (int)uVar112) * uVar112 | ((int)uVar93 >= (int)uVar112) * uVar93
                ;
                auVar89._12_4_ =
                     ((int)uVar94 < (int)uVar114) * uVar114 | ((int)uVar94 >= (int)uVar114) * uVar94
                ;
                uVar104 = (uint)((int)fVar51 < (int)fVar64) * (int)fVar64 |
                          (uint)((int)fVar51 >= (int)fVar64) * (int)fVar51;
                uVar110 = (uint)((int)fVar61 < (int)fVar72) * (int)fVar72 |
                          (uint)((int)fVar61 >= (int)fVar72) * (int)fVar61;
                uVar112 = (uint)((int)fVar62 < (int)fVar73) * (int)fVar73 |
                          (uint)((int)fVar62 >= (int)fVar73) * (int)fVar62;
                uVar114 = (uint)((int)fVar63 < (int)fVar74) * (int)fVar74 |
                          (uint)((int)fVar63 >= (int)fVar74) * (int)fVar63;
                uVar16 = (uint)((int)fVar34 < (int)fVar75) * (int)fVar75 |
                         (uint)((int)fVar34 >= (int)fVar75) * (int)fVar34;
                uVar92 = (uint)((int)fVar48 < (int)fVar78) * (int)fVar78 |
                         (uint)((int)fVar48 >= (int)fVar78) * (int)fVar48;
                uVar93 = (uint)((int)fVar49 < (int)fVar79) * (int)fVar79 |
                         (uint)((int)fVar49 >= (int)fVar79) * (int)fVar49;
                uVar94 = (uint)((int)fVar50 < (int)fVar80) * (int)fVar80 |
                         (uint)((int)fVar50 >= (int)fVar80) * (int)fVar50;
                uVar16 = ((int)uVar104 < (int)uVar16) * uVar104 |
                         ((int)uVar104 >= (int)uVar16) * uVar16;
                uVar92 = ((int)uVar110 < (int)uVar92) * uVar110 |
                         ((int)uVar110 >= (int)uVar92) * uVar92;
                uVar93 = ((int)uVar112 < (int)uVar93) * uVar112 |
                         ((int)uVar112 >= (int)uVar93) * uVar93;
                uVar94 = ((int)uVar114 < (int)uVar94) * uVar114 |
                         ((int)uVar114 >= (int)uVar94) * uVar94;
                uVar104 = (uint)((int)fVar96 < (int)fVar81) * (int)fVar81 |
                          (uint)((int)fVar96 >= (int)fVar81) * (int)fVar96;
                uVar110 = (uint)((int)fVar99 < (int)fVar85) * (int)fVar85 |
                          (uint)((int)fVar99 >= (int)fVar85) * (int)fVar99;
                uVar112 = (uint)((int)fVar101 < (int)fVar86) * (int)fVar86 |
                          (uint)((int)fVar101 >= (int)fVar86) * (int)fVar101;
                uVar114 = (uint)((int)fVar103 < (int)fVar87) * (int)fVar87 |
                          (uint)((int)fVar103 >= (int)fVar87) * (int)fVar103;
                uVar16 = ((int)uVar16 < (int)uVar104) * uVar16 |
                         ((int)uVar16 >= (int)uVar104) * uVar104;
                uVar92 = ((int)uVar92 < (int)uVar110) * uVar92 |
                         ((int)uVar92 >= (int)uVar110) * uVar110;
                uVar93 = ((int)uVar93 < (int)uVar112) * uVar93 |
                         ((int)uVar93 >= (int)uVar112) * uVar112;
                uVar94 = ((int)uVar94 < (int)uVar114) * uVar94 |
                         ((int)uVar94 >= (int)uVar114) * uVar114;
                auVar38._4_4_ =
                     -(uint)((float)((tray.tnear.field_0.i[1] < (int)auVar89._4_4_) * auVar89._4_4_
                                    | (uint)(tray.tnear.field_0.i[1] >= (int)auVar89._4_4_) *
                                      tray.tnear.field_0.i[1]) <=
                            (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar92) *
                                    tray.tfar.field_0.i[1] |
                                   (tray.tfar.field_0.i[1] >= (int)uVar92) * uVar92));
                auVar38._0_4_ =
                     -(uint)((float)((tray.tnear.field_0.i[0] < (int)auVar89._0_4_) * auVar89._0_4_
                                    | (uint)(tray.tnear.field_0.i[0] >= (int)auVar89._0_4_) *
                                      tray.tnear.field_0.i[0]) <=
                            (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar16) *
                                    tray.tfar.field_0.i[0] |
                                   (tray.tfar.field_0.i[0] >= (int)uVar16) * uVar16));
                auVar38._8_4_ =
                     -(uint)((float)((tray.tnear.field_0.i[2] < (int)auVar89._8_4_) * auVar89._8_4_
                                    | (uint)(tray.tnear.field_0.i[2] >= (int)auVar89._8_4_) *
                                      tray.tnear.field_0.i[2]) <=
                            (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar93) *
                                    tray.tfar.field_0.i[2] |
                                   (tray.tfar.field_0.i[2] >= (int)uVar93) * uVar93));
                auVar38._12_4_ =
                     -(uint)((float)((tray.tnear.field_0.i[3] < (int)auVar89._12_4_) *
                                     auVar89._12_4_ |
                                    (uint)(tray.tnear.field_0.i[3] >= (int)auVar89._12_4_) *
                                    tray.tnear.field_0.i[3]) <=
                            (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar94) *
                                    tray.tfar.field_0.i[3] |
                                   (tray.tfar.field_0.i[3] >= (int)uVar94) * uVar94));
                uVar16 = movmskps((int)valid_i,auVar38);
                valid_i = (vint<4> *)(ulong)uVar16;
                if (uVar16 != 0) {
                  auVar53._4_4_ = fVar98;
                  auVar53._0_4_ = fVar95;
                  auVar53._8_4_ = fVar100;
                  auVar53._12_4_ = fVar102;
                  auVar54 = blendvps(auVar53,auVar89,auVar38);
                  if (uVar25 != 8) {
                    pNVar32->ptr = uVar25;
                    pNVar32 = pNVar32 + 1;
                    paVar29->v[0] = local_19f8;
                    paVar29->v[1] = fStack_19f4;
                    paVar29->v[2] = fStack_19f0;
                    paVar29->v[3] = fStack_19ec;
                    paVar29 = paVar29 + 1;
                  }
                  local_19f8 = auVar54._0_4_;
                  fStack_19f4 = auVar54._4_4_;
                  fStack_19f0 = auVar54._8_4_;
                  fStack_19ec = auVar54._12_4_;
                  uVar25 = uVar19;
                }
              }
            } while ((uVar19 != 8) &&
                    (valid_i = (vint<4> *)((long)&pIVar24->ptr + 1),
                    bVar33 = pIVar24 < (Intersectors *)0x3, pIVar24 = (Intersectors *)valid_i,
                    bVar33));
            iVar20 = 0;
            if (uVar25 == 8) {
LAB_0024737a:
              bVar33 = false;
              iVar20 = 4;
            }
            else {
              auVar39._4_4_ = -(uint)(fStack_19f4 < tray.tfar.field_0.v[1]);
              auVar39._0_4_ = -(uint)(local_19f8 < tray.tfar.field_0.v[0]);
              auVar39._8_4_ = -(uint)(fStack_19f0 < tray.tfar.field_0.v[2]);
              auVar39._12_4_ = -(uint)(fStack_19ec < tray.tfar.field_0.v[3]);
              uVar21 = movmskps((int)(root.ptr & 0xfffffffffffffff0),auVar39);
              bVar33 = true;
              if ((uint)POPCOUNT(uVar21) <= uVar27) {
                pNVar32->ptr = uVar25;
                pNVar32 = pNVar32 + 1;
                paVar29->v[0] = local_19f8;
                paVar29->v[1] = fStack_19f4;
                paVar29->v[2] = fStack_19f0;
                paVar29->v[3] = fStack_19ec;
                paVar29 = paVar29 + 1;
                goto LAB_0024737a;
              }
            }
            root.ptr = uVar25;
          } while (bVar33);
        }
      }
      goto LAB_00248083;
    }
  }
  return;
  while( true ) {
    uVar19 = uVar19 + 1;
    lVar30 = lVar30 + 0x60;
    auVar41 = auVar46;
    if (uVar25 - 8 <= uVar19) break;
LAB_002473cc:
    pSVar2 = context->scene;
    uVar31 = 0;
    auVar54 = auVar41;
    while( true ) {
      uVar16 = *(uint *)(lVar30 + uVar31 * 4);
      uVar17 = (ulong)uVar16;
      if (uVar16 == 0xffffffff) break;
      uVar92 = *(uint *)(lVar30 + -0x10 + uVar31 * 4);
      pfVar3 = (pSVar2->vertices).items[uVar92];
      uVar26 = (ulong)*(uint *)(lVar30 + -0x50 + uVar31 * 4);
      uVar17 = (ulong)*(uint *)(lVar30 + -0x40 + uVar31 * 4);
      fVar95 = pfVar3[uVar26];
      fVar98 = pfVar3[uVar26 + 1];
      fVar100 = pfVar3[uVar26 + 2];
      fVar102 = pfVar3[uVar17];
      _local_1978 = ZEXT416((uint)pfVar3[uVar17 + 1]);
      fVar103 = pfVar3[uVar17 + 2];
      uVar93 = *(uint *)(lVar30 + -0x20 + uVar31 * 4);
      fVar34 = pfVar3[uVar93];
      fVar48 = pfVar3[(ulong)uVar93 + 1];
      fVar50 = pfVar3[(ulong)uVar93 + 2];
      fVar123 = fVar48 - fVar98;
      fVar129 = fVar98 - pfVar3[uVar17 + 1];
      fVar99 = fVar50 - fVar100;
      fVar118 = fVar100 - fVar103;
      fVar121 = fVar118 * fVar123 - fVar129 * fVar99;
      fVar115 = fVar34 - fVar95;
      fVar101 = fVar95 - fVar102;
      auVar77._0_4_ = fVar99 * fVar101 - fVar118 * fVar115;
      fVar116 = fVar115 * fVar129 - fVar123 * fVar101;
      fVar80 = fVar95 - *(float *)ray;
      fVar81 = fVar95 - *(float *)(ray + 4);
      fVar85 = fVar95 - *(float *)(ray + 8);
      fVar95 = fVar95 - *(float *)(ray + 0xc);
      fVar86 = fVar98 - *(float *)(ray + 0x10);
      fVar87 = fVar98 - *(float *)(ray + 0x14);
      fVar96 = fVar98 - *(float *)(ray + 0x18);
      fVar98 = fVar98 - *(float *)(ray + 0x1c);
      fVar105 = fVar100 - *(float *)(ray + 0x20);
      fVar111 = fVar100 - *(float *)(ray + 0x24);
      fVar113 = fVar100 - *(float *)(ray + 0x28);
      fVar100 = fVar100 - *(float *)(ray + 0x2c);
      fVar49 = *(float *)(ray + 0x50);
      fVar51 = *(float *)(ray + 0x54);
      fVar61 = *(float *)(ray + 0x58);
      fVar62 = *(float *)(ray + 0x5c);
      fVar63 = *(float *)(ray + 0x60);
      fVar64 = *(float *)(ray + 100);
      fVar72 = *(float *)(ray + 0x68);
      fVar73 = *(float *)(ray + 0x6c);
      fVar130 = fVar86 * fVar63 - fVar105 * fVar49;
      fVar132 = fVar87 * fVar64 - fVar111 * fVar51;
      fVar134 = fVar96 * fVar72 - fVar113 * fVar61;
      fVar136 = fVar98 * fVar73 - fVar100 * fVar62;
      fVar74 = *(float *)(ray + 0x40);
      fVar75 = *(float *)(ray + 0x44);
      fVar78 = *(float *)(ray + 0x48);
      fVar79 = *(float *)(ray + 0x4c);
      fVar141 = fVar105 * fVar74 - fVar80 * fVar63;
      fVar143 = fVar111 * fVar75 - fVar81 * fVar64;
      fVar145 = fVar113 * fVar78 - fVar85 * fVar72;
      fVar147 = fVar100 * fVar79 - fVar95 * fVar73;
      fVar149 = fVar80 * fVar49 - fVar86 * fVar74;
      fVar151 = fVar81 * fVar51 - fVar87 * fVar75;
      fVar153 = fVar85 * fVar61 - fVar96 * fVar78;
      fVar155 = fVar95 * fVar62 - fVar98 * fVar79;
      auVar77._4_4_ = auVar77._0_4_;
      auVar77._8_4_ = auVar77._0_4_;
      auVar77._12_4_ = auVar77._0_4_;
      fVar74 = fVar74 * fVar121 + fVar49 * auVar77._0_4_ + fVar63 * fVar116;
      fVar75 = fVar75 * fVar121 + fVar51 * auVar77._0_4_ + fVar64 * fVar116;
      fVar78 = fVar78 * fVar121 + fVar61 * auVar77._0_4_ + fVar72 * fVar116;
      fVar73 = fVar79 * fVar121 + fVar62 * auVar77._0_4_ + fVar73 * fVar116;
      uVar17 = (ulong)*(uint *)(lVar30 + -0x30 + uVar31 * 4);
      uVar94 = (uint)fVar74 & 0x80000000;
      uVar104 = (uint)fVar75 & 0x80000000;
      uVar110 = (uint)fVar78 & 0x80000000;
      uVar112 = (uint)fVar73 & 0x80000000;
      fVar62 = (float)((uint)(fVar115 * fVar130 + fVar123 * fVar141 + fVar99 * fVar149) ^ uVar94);
      fVar63 = (float)((uint)(fVar115 * fVar132 + fVar123 * fVar143 + fVar99 * fVar151) ^ uVar104);
      fVar64 = (float)((uint)(fVar115 * fVar134 + fVar123 * fVar145 + fVar99 * fVar153) ^ uVar110);
      fVar72 = (float)((uint)(fVar115 * fVar136 + fVar123 * fVar147 + fVar99 * fVar155) ^ uVar112);
      auVar65._0_4_ = -(uint)(0.0 <= fVar62) & auVar54._0_4_;
      auVar65._4_4_ = -(uint)(0.0 <= fVar63) & auVar54._4_4_;
      auVar65._8_4_ = -(uint)(0.0 <= fVar64) & auVar54._8_4_;
      auVar65._12_4_ = -(uint)(0.0 <= fVar72) & auVar54._12_4_;
      uVar93 = movmskps(uVar93,auVar65);
      valid_i = (vint<4> *)(ulong)uVar93;
      fVar49 = pfVar3[uVar17];
      fVar51 = pfVar3[uVar17 + 1];
      fVar61 = pfVar3[uVar17 + 2];
      if (uVar93 != 0) {
        fVar79 = (float)((uint)(fVar101 * fVar130 + fVar129 * fVar141 + fVar118 * fVar149) ^ uVar94)
        ;
        fVar99 = (float)((uint)(fVar101 * fVar132 + fVar129 * fVar143 + fVar118 * fVar151) ^ uVar104
                        );
        fVar115 = (float)((uint)(fVar101 * fVar134 + fVar129 * fVar145 + fVar118 * fVar153) ^
                         uVar110);
        fVar101 = (float)((uint)(fVar101 * fVar136 + fVar129 * fVar147 + fVar118 * fVar155) ^
                         uVar112);
        uVar93 = -(uint)(0.0 <= fVar79) & auVar65._0_4_;
        uVar114 = -(uint)(0.0 <= fVar99) & auVar65._4_4_;
        uVar117 = -(uint)(0.0 <= fVar115) & auVar65._8_4_;
        uVar137 = -(uint)(0.0 <= fVar101) & auVar65._12_4_;
        auVar9._4_4_ = uVar114;
        auVar9._0_4_ = uVar93;
        auVar9._8_4_ = uVar117;
        auVar9._12_4_ = uVar137;
        iVar20 = movmskps((int)pfVar3,auVar9);
        if (iVar20 != 0) {
          fVar118 = ABS(fVar74);
          fVar123 = ABS(fVar75);
          fVar129 = ABS(fVar78);
          fVar130 = ABS(fVar73);
          auVar83._0_4_ = -(uint)(fVar79 <= fVar118 - fVar62) & uVar93;
          auVar83._4_4_ = -(uint)(fVar99 <= fVar123 - fVar63) & uVar114;
          auVar83._8_4_ = -(uint)(fVar115 <= fVar129 - fVar64) & uVar117;
          auVar83._12_4_ = -(uint)(fVar101 <= fVar130 - fVar72) & uVar137;
          iVar20 = movmskps(iVar20,auVar83);
          if (iVar20 != 0) {
            fVar80 = (float)(uVar94 ^ (uint)(fVar80 * fVar121 +
                                            fVar86 * auVar77._0_4_ + fVar105 * fVar116));
            fVar81 = (float)(uVar104 ^
                            (uint)(fVar81 * fVar121 + fVar87 * auVar77._0_4_ + fVar111 * fVar116));
            fVar85 = (float)(uVar110 ^
                            (uint)(fVar85 * fVar121 + fVar96 * auVar77._0_4_ + fVar113 * fVar116));
            fVar95 = (float)(uVar112 ^
                            (uint)(fVar95 * fVar121 + fVar98 * auVar77._0_4_ + fVar100 * fVar116));
            pRVar1 = ray + 0x80;
            auVar44 = *(undefined1 (*) [16])pRVar1;
            auVar126._0_4_ =
                 -(uint)(fVar80 <= fVar118 * *(float *)pRVar1 &&
                        *(float *)(ray + 0x30) * fVar118 < fVar80) & auVar83._0_4_;
            auVar126._4_4_ =
                 -(uint)(fVar81 <= fVar123 * *(float *)(ray + 0x84) &&
                        *(float *)(ray + 0x34) * fVar123 < fVar81) & auVar83._4_4_;
            auVar126._8_4_ =
                 -(uint)(fVar85 <= fVar129 * *(float *)(ray + 0x88) &&
                        *(float *)(ray + 0x38) * fVar129 < fVar85) & auVar83._8_4_;
            auVar126._12_4_ =
                 -(uint)(fVar95 <= fVar130 * *(float *)(ray + 0x8c) &&
                        *(float *)(ray + 0x3c) * fVar130 < fVar95) & auVar83._12_4_;
            iVar20 = movmskps(iVar20,auVar126);
            if (iVar20 != 0) {
              auVar97._0_4_ = -(uint)(fVar74 != 0.0) & auVar126._0_4_;
              auVar97._4_4_ = -(uint)(fVar75 != 0.0) & auVar126._4_4_;
              auVar97._8_4_ = -(uint)(fVar78 != 0.0) & auVar126._8_4_;
              auVar97._12_4_ = -(uint)(fVar73 != 0.0) & auVar126._12_4_;
              iVar20 = movmskps(iVar20,auVar97);
              if (iVar20 != 0) {
                pGVar4 = (context->scene->geometries).items[uVar92].ptr;
                uVar93 = pGVar4->mask;
                auVar56._0_4_ = -(uint)((uVar93 & *(uint *)(ray + 0x90)) == 0);
                auVar56._4_4_ = -(uint)((uVar93 & *(uint *)(ray + 0x94)) == 0);
                auVar56._8_4_ = -(uint)((uVar93 & *(uint *)(ray + 0x98)) == 0);
                auVar56._12_4_ = -(uint)((uVar93 & *(uint *)(ray + 0x9c)) == 0);
                auVar57 = ~auVar56 & auVar97;
                iVar20 = movmskps((int)pGVar4,auVar57);
                if (iVar20 != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar11._4_4_ = fVar123;
                    auVar11._0_4_ = fVar118;
                    auVar11._8_4_ = fVar129;
                    auVar11._12_4_ = fVar130;
                    auVar76 = rcpps(ZEXT416(uVar93),auVar11);
                    fVar98 = auVar76._0_4_;
                    fVar100 = auVar76._4_4_;
                    fVar73 = auVar76._8_4_;
                    fVar74 = auVar76._12_4_;
                    fVar75 = (float)DAT_01feca10;
                    fVar78 = DAT_01feca10._4_4_;
                    fVar86 = DAT_01feca10._12_4_;
                    fVar87 = DAT_01feca10._8_4_;
                    fVar98 = (fVar75 - fVar118 * fVar98) * fVar98 + fVar98;
                    fVar100 = (fVar78 - fVar123 * fVar100) * fVar100 + fVar100;
                    fVar73 = (fVar87 - fVar129 * fVar73) * fVar73 + fVar73;
                    fVar74 = (fVar86 - fVar130 * fVar74) * fVar74 + fVar74;
                    auVar91._0_4_ = fVar62 * fVar98;
                    auVar91._4_4_ = fVar63 * fVar100;
                    auVar91._8_4_ = fVar64 * fVar73;
                    auVar91._12_4_ = fVar72 * fVar74;
                    auVar76 = minps(auVar91,_DAT_01feca10);
                    auVar119._0_4_ = fVar79 * fVar98;
                    auVar119._4_4_ = fVar99 * fVar100;
                    auVar119._8_4_ = fVar115 * fVar73;
                    auVar119._12_4_ = fVar101 * fVar74;
                    auVar36 = minps(auVar119,_DAT_01feca10);
                    auVar66._0_4_ = fVar75 - auVar76._0_4_;
                    auVar66._4_4_ = fVar78 - auVar76._4_4_;
                    auVar66._8_4_ = fVar87 - auVar76._8_4_;
                    auVar66._12_4_ = fVar86 - auVar76._12_4_;
                    auVar84._0_4_ = fVar75 - auVar36._0_4_;
                    auVar84._4_4_ = fVar78 - auVar36._4_4_;
                    auVar84._8_4_ = fVar87 - auVar36._8_4_;
                    auVar84._12_4_ = fVar86 - auVar36._12_4_;
                    auVar12._8_8_ = uVar15;
                    auVar12._0_8_ = uVar14;
                    local_1868 = blendvps(auVar76,auVar66,auVar12);
                    local_1858 = blendvps(auVar36,auVar84,auVar12);
                    local_1898 = (OccludedFunc8)CONCAT44(fVar121,fVar121);
                    p_Stack_1890 = (IntersectFunc4)CONCAT44(fVar121,fVar121);
                    local_1848._4_4_ = uVar16;
                    local_1848._0_4_ = uVar16;
                    local_1848._8_4_ = uVar16;
                    local_1848._12_4_ = uVar16;
                    auVar108._0_4_ = fVar98 * fVar80;
                    auVar108._4_4_ = fVar100 * fVar81;
                    auVar108._8_4_ = fVar73 * fVar85;
                    auVar108._12_4_ = fVar74 * fVar95;
                    local_1828 = context->user->instID[0];
                    local_1818 = context->user->instPrimID[0];
                    auVar76 = blendvps(*(undefined1 (*) [16])pRVar1,auVar108,auVar57);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar76;
                    args.valid = (int *)local_1988;
                    args.geometryUserPtr = pGVar4->userPtr;
                    args.context = context->user;
                    args.hit = (RTCHitN *)&local_1898;
                    args.N = 4;
                    pRVar18 = (RTCRayN *)pGVar4->occlusionFilterN;
                    local_1988 = auVar57;
                    args.ray = (RTCRayN *)ray;
                    local_1888 = auVar77;
                    local_1878 = fVar116;
                    fStack_1874 = fVar116;
                    fStack_1870 = fVar116;
                    fStack_186c = fVar116;
                    local_1838 = uVar92;
                    uStack_1834 = uVar92;
                    uStack_1830 = uVar92;
                    uStack_182c = uVar92;
                    uStack_1824 = local_1828;
                    uStack_1820 = local_1828;
                    uStack_181c = local_1828;
                    uStack_1814 = local_1818;
                    uStack_1810 = local_1818;
                    uStack_180c = local_1818;
                    if (pRVar18 != (RTCRayN *)0x0) {
                      valid_i = (vint<4> *)&args;
                      pRVar18 = (RTCRayN *)(*(code *)pRVar18)();
                    }
                    if (local_1988 == (undefined1  [16])0x0) {
                      auVar67._8_4_ = 0xffffffff;
                      auVar67._0_8_ = 0xffffffffffffffff;
                      auVar67._12_4_ = 0xffffffff;
                      auVar67 = auVar67 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        valid_i = (vint<4> *)&args;
                        (*p_Var5)((RTCFilterFunctionNArguments *)valid_i);
                      }
                      auVar43._0_4_ = -(uint)(local_1988._0_4_ == 0);
                      auVar43._4_4_ = -(uint)(local_1988._4_4_ == 0);
                      auVar43._8_4_ = -(uint)(local_1988._8_4_ == 0);
                      auVar43._12_4_ = -(uint)(local_1988._12_4_ == 0);
                      auVar67 = auVar43 ^ _DAT_01febe20;
                      auVar76 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),
                                         auVar43);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar76;
                      pRVar18 = args.ray;
                    }
                    uVar16 = (uint)pRVar18;
                    auVar70._0_4_ = auVar67._0_4_ << 0x1f;
                    auVar70._4_4_ = auVar67._4_4_ << 0x1f;
                    auVar70._8_4_ = auVar67._8_4_ << 0x1f;
                    auVar70._12_4_ = auVar67._12_4_ << 0x1f;
                    auVar57._0_4_ = auVar70._0_4_ >> 0x1f;
                    auVar57._4_4_ = auVar70._4_4_ >> 0x1f;
                    auVar57._8_4_ = auVar70._8_4_ >> 0x1f;
                    auVar57._12_4_ = auVar70._12_4_ >> 0x1f;
                    auVar44 = blendvps(auVar44,*(undefined1 (*) [16])(ray + 0x80),auVar70);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar44;
                  }
                  auVar54 = ~auVar57 & auVar54;
                }
              }
            }
          }
        }
      }
      iVar20 = movmskps(uVar16,auVar54);
      if (iVar20 == 0) {
        uVar16 = 0;
      }
      else {
        fVar113 = fVar49 - fVar34;
        fVar115 = fVar49 - fVar34;
        fVar116 = fVar49 - fVar34;
        fVar34 = fVar49 - fVar34;
        fVar129 = fVar51 - fVar48;
        local_1978._4_4_ = fVar51 - fVar48;
        fStack_1970 = fVar51 - fVar48;
        fStack_196c = fVar51 - fVar48;
        fVar85 = fVar61 - fVar50;
        fVar86 = fVar61 - fVar50;
        fVar87 = fVar61 - fVar50;
        fVar50 = fVar61 - fVar50;
        fVar118 = fVar102 - fVar49;
        fVar121 = fVar102 - fVar49;
        fVar123 = fVar102 - fVar49;
        fVar102 = fVar102 - fVar49;
        fVar150 = (float)local_1978._0_4_ - fVar51;
        fVar152 = (float)local_1978._0_4_ - fVar51;
        fVar154 = (float)local_1978._0_4_ - fVar51;
        fVar156 = (float)local_1978._0_4_ - fVar51;
        fVar138 = fVar103 - fVar61;
        fVar139 = fVar103 - fVar61;
        fVar140 = fVar103 - fVar61;
        fVar103 = fVar103 - fVar61;
        fVar105 = fVar150 * fVar85 - fVar138 * fVar129;
        fVar111 = fVar152 * fVar86 - fVar139 * (float)local_1978._4_4_;
        auVar90._0_8_ = (OccludedFunc8)CONCAT44(fVar111,fVar105);
        auVar90._8_4_ = fVar154 * fVar87 - fVar140 * fStack_1970;
        auVar90._12_4_ = fVar156 * fVar50 - fVar103 * fStack_196c;
        auVar82._0_4_ = fVar138 * fVar113 - fVar118 * fVar85;
        auVar82._4_4_ = fVar139 * fVar115 - fVar121 * fVar86;
        auVar82._8_4_ = fVar140 * fVar116 - fVar123 * fVar87;
        auVar82._12_4_ = fVar103 * fVar34 - fVar102 * fVar50;
        local_1978._0_4_ = fVar129;
        fVar142 = fVar118 * fVar129 - fVar150 * fVar113;
        fVar144 = fVar121 * (float)local_1978._4_4_ - fVar152 * fVar115;
        fVar146 = fVar123 * fStack_1970 - fVar154 * fVar116;
        fVar148 = fVar102 * fStack_196c - fVar156 * fVar34;
        fVar96 = fVar49 - *(float *)ray;
        fVar99 = fVar49 - *(float *)(ray + 4);
        fVar101 = fVar49 - *(float *)(ray + 8);
        fVar49 = fVar49 - *(float *)(ray + 0xc);
        fVar131 = fVar51 - *(float *)(ray + 0x10);
        fVar133 = fVar51 - *(float *)(ray + 0x14);
        fVar135 = fVar51 - *(float *)(ray + 0x18);
        fVar51 = fVar51 - *(float *)(ray + 0x1c);
        fVar79 = fVar61 - *(float *)(ray + 0x20);
        fVar80 = fVar61 - *(float *)(ray + 0x24);
        fVar81 = fVar61 - *(float *)(ray + 0x28);
        fVar61 = fVar61 - *(float *)(ray + 0x2c);
        fVar95 = *(float *)(ray + 0x40);
        fVar98 = *(float *)(ray + 0x44);
        fVar100 = *(float *)(ray + 0x48);
        fVar48 = *(float *)(ray + 0x4c);
        fVar62 = *(float *)(ray + 0x50);
        fVar63 = *(float *)(ray + 0x54);
        fVar64 = *(float *)(ray + 0x58);
        fVar72 = *(float *)(ray + 0x5c);
        fVar73 = *(float *)(ray + 0x60);
        fVar74 = *(float *)(ray + 100);
        fVar75 = *(float *)(ray + 0x68);
        fVar78 = *(float *)(ray + 0x6c);
        fVar130 = fVar131 * fVar73 - fVar79 * fVar62;
        fVar132 = fVar133 * fVar74 - fVar80 * fVar63;
        fVar134 = fVar135 * fVar75 - fVar81 * fVar64;
        fVar136 = fVar51 * fVar78 - fVar61 * fVar72;
        fVar141 = fVar79 * fVar95 - fVar96 * fVar73;
        fVar143 = fVar80 * fVar98 - fVar99 * fVar74;
        fVar145 = fVar81 * fVar100 - fVar101 * fVar75;
        fVar147 = fVar61 * fVar48 - fVar49 * fVar78;
        fVar149 = fVar96 * fVar62 - fVar131 * fVar95;
        fVar151 = fVar99 * fVar63 - fVar133 * fVar98;
        fVar153 = fVar101 * fVar64 - fVar135 * fVar100;
        fVar155 = fVar49 * fVar72 - fVar51 * fVar48;
        fVar95 = fVar95 * fVar105 + fVar62 * auVar82._0_4_ + fVar73 * fVar142;
        fVar98 = fVar98 * fVar111 + fVar63 * auVar82._4_4_ + fVar74 * fVar144;
        fVar100 = fVar100 * auVar90._8_4_ + fVar64 * auVar82._8_4_ + fVar75 * fVar146;
        fVar48 = fVar48 * auVar90._12_4_ + fVar72 * auVar82._12_4_ + fVar78 * fVar148;
        uVar92 = (uint)fVar95 & 0x80000000;
        uVar93 = (uint)fVar98 & 0x80000000;
        uVar94 = (uint)fVar100 & 0x80000000;
        uVar104 = (uint)fVar48 & 0x80000000;
        fVar62 = (float)((uint)(fVar118 * fVar130 + fVar150 * fVar141 + fVar138 * fVar149) ^ uVar92)
        ;
        fVar63 = (float)((uint)(fVar121 * fVar132 + fVar152 * fVar143 + fVar139 * fVar151) ^ uVar93)
        ;
        fVar64 = (float)((uint)(fVar123 * fVar134 + fVar154 * fVar145 + fVar140 * fVar153) ^ uVar94)
        ;
        fVar102 = (float)((uint)(fVar102 * fVar136 + fVar156 * fVar147 + fVar103 * fVar155) ^
                         uVar104);
        auVar125._0_4_ = -(uint)(0.0 <= fVar62) & auVar54._0_4_;
        auVar125._4_4_ = -(uint)(0.0 <= fVar63) & auVar54._4_4_;
        auVar125._8_4_ = -(uint)(0.0 <= fVar64) & auVar54._8_4_;
        auVar125._12_4_ = -(uint)(0.0 <= fVar102) & auVar54._12_4_;
        uVar16 = movmskps(iVar20,auVar125);
        if (uVar16 != 0) {
          fVar103 = (float)((uint)(fVar113 * fVar130 + fVar129 * fVar141 + fVar85 * fVar149) ^
                           uVar92);
          fVar72 = (float)((uint)(fVar115 * fVar132 +
                                 (float)local_1978._4_4_ * fVar143 + fVar86 * fVar151) ^ uVar93);
          fVar73 = (float)((uint)(fVar116 * fVar134 + fStack_1970 * fVar145 + fVar87 * fVar153) ^
                          uVar94);
          fVar34 = (float)((uint)(fVar34 * fVar136 + fStack_196c * fVar147 + fVar50 * fVar155) ^
                          uVar104);
          uVar110 = -(uint)(0.0 <= fVar103) & auVar125._0_4_;
          uVar112 = -(uint)(0.0 <= fVar72) & auVar125._4_4_;
          uVar114 = -(uint)(0.0 <= fVar73) & auVar125._8_4_;
          uVar117 = -(uint)(0.0 <= fVar34) & auVar125._12_4_;
          auVar6._4_4_ = uVar112;
          auVar6._0_4_ = uVar110;
          auVar6._8_4_ = uVar114;
          auVar6._12_4_ = uVar117;
          uVar16 = movmskps(uVar16,auVar6);
          if (uVar16 != 0) {
            fVar50 = ABS(fVar95);
            fVar74 = ABS(fVar98);
            fVar75 = ABS(fVar100);
            fVar78 = ABS(fVar48);
            auVar55._0_4_ = -(uint)(fVar103 <= fVar50 - fVar62) & uVar110;
            auVar55._4_4_ = -(uint)(fVar72 <= fVar74 - fVar63) & uVar112;
            auVar55._8_4_ = -(uint)(fVar73 <= fVar75 - fVar64) & uVar114;
            auVar55._12_4_ = -(uint)(fVar34 <= fVar78 - fVar102) & uVar117;
            uVar16 = movmskps(uVar16,auVar55);
            if (uVar16 != 0) {
              fVar79 = (float)(uVar92 ^ (uint)(fVar96 * fVar105 +
                                              fVar131 * auVar82._0_4_ + fVar79 * fVar142));
              fVar80 = (float)(uVar93 ^ (uint)(fVar99 * fVar111 +
                                              fVar133 * auVar82._4_4_ + fVar80 * fVar144));
              fVar81 = (float)(uVar94 ^ (uint)(fVar101 * auVar90._8_4_ +
                                              fVar135 * auVar82._8_4_ + fVar81 * fVar146));
              fVar49 = (float)(uVar104 ^
                              (uint)(fVar49 * auVar90._12_4_ +
                                    fVar51 * auVar82._12_4_ + fVar61 * fVar148));
              _local_1978 = *(undefined1 (*) [16])(ray + 0x80);
              uVar92 = -(uint)(fVar79 <= fVar50 * local_1978._0_4_ &&
                              *(float *)(ray + 0x30) * fVar50 < fVar79) & auVar55._0_4_;
              uVar93 = -(uint)(fVar80 <= fVar74 * local_1978._4_4_ &&
                              *(float *)(ray + 0x34) * fVar74 < fVar80) & auVar55._4_4_;
              uVar94 = -(uint)(fVar81 <= fVar75 * local_1978._8_4_ &&
                              *(float *)(ray + 0x38) * fVar75 < fVar81) & auVar55._8_4_;
              uVar104 = -(uint)(fVar49 <= fVar78 * local_1978._12_4_ &&
                               *(float *)(ray + 0x3c) * fVar78 < fVar49) & auVar55._12_4_;
              auVar7._4_4_ = uVar93;
              auVar7._0_4_ = uVar92;
              auVar7._8_4_ = uVar94;
              auVar7._12_4_ = uVar104;
              uVar16 = movmskps(uVar16,auVar7);
              if (uVar16 != 0) {
                auVar42._0_4_ = -(uint)(fVar95 != 0.0) & uVar92;
                auVar42._4_4_ = -(uint)(fVar98 != 0.0) & uVar93;
                auVar42._8_4_ = -(uint)(fVar100 != 0.0) & uVar94;
                auVar42._12_4_ = -(uint)(fVar48 != 0.0) & uVar104;
                uVar16 = movmskps(uVar16,auVar42);
                if (uVar16 != 0) {
                  uVar16 = *(uint *)(lVar30 + -0x10 + uVar31 * 4);
                  pGVar4 = (context->scene->geometries).items[uVar16].ptr;
                  uVar92 = pGVar4->mask;
                  auVar58._0_4_ = -(uint)((uVar92 & *(uint *)(ray + 0x90)) == 0);
                  auVar58._4_4_ = -(uint)((uVar92 & *(uint *)(ray + 0x94)) == 0);
                  auVar58._8_4_ = -(uint)((uVar92 & *(uint *)(ray + 0x98)) == 0);
                  auVar58._12_4_ = -(uint)((uVar92 & *(uint *)(ray + 0x9c)) == 0);
                  auVar59 = ~auVar58 & auVar42;
                  iVar20 = movmskps((int)pGVar4,auVar59);
                  if (iVar20 != 0) {
                    uVar21 = *(undefined4 *)(lVar30 + uVar31 * 4);
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar10._4_4_ = fVar74;
                      auVar10._0_4_ = fVar50;
                      auVar10._8_4_ = fVar75;
                      auVar10._12_4_ = fVar78;
                      auVar44 = rcpps(auVar42,auVar10);
                      fVar95 = auVar44._0_4_;
                      fVar98 = auVar44._4_4_;
                      fVar100 = auVar44._8_4_;
                      fVar48 = auVar44._12_4_;
                      fVar51 = (float)DAT_01feca10;
                      fVar61 = DAT_01feca10._4_4_;
                      fVar85 = DAT_01feca10._8_4_;
                      fVar86 = DAT_01feca10._12_4_;
                      fVar95 = (fVar51 - fVar50 * fVar95) * fVar95 + fVar95;
                      fVar98 = (fVar61 - fVar74 * fVar98) * fVar98 + fVar98;
                      fVar100 = (fVar85 - fVar75 * fVar100) * fVar100 + fVar100;
                      fVar48 = (fVar86 - fVar78 * fVar48) * fVar48 + fVar48;
                      auVar127._0_4_ = fVar62 * fVar95;
                      auVar127._4_4_ = fVar63 * fVar98;
                      auVar127._8_4_ = fVar64 * fVar100;
                      auVar127._12_4_ = fVar102 * fVar48;
                      auVar76 = minps(auVar127,_DAT_01feca10);
                      auVar68._0_4_ = fVar103 * fVar95;
                      auVar68._4_4_ = fVar72 * fVar98;
                      auVar68._8_4_ = fVar73 * fVar100;
                      auVar68._12_4_ = fVar34 * fVar48;
                      auVar44 = minps(auVar68,_DAT_01feca10);
                      auVar109._0_4_ = fVar51 - auVar76._0_4_;
                      auVar109._4_4_ = fVar61 - auVar76._4_4_;
                      auVar109._8_4_ = fVar85 - auVar76._8_4_;
                      auVar109._12_4_ = fVar86 - auVar76._12_4_;
                      auVar120._0_4_ = fVar51 - auVar44._0_4_;
                      auVar120._4_4_ = fVar61 - auVar44._4_4_;
                      auVar120._8_4_ = fVar85 - auVar44._8_4_;
                      auVar120._12_4_ = fVar86 - auVar44._12_4_;
                      local_1868 = blendvps(auVar76,auVar109,auVar60);
                      local_1858 = blendvps(auVar44,auVar120,auVar60);
                      local_1848._4_4_ = uVar21;
                      local_1848._0_4_ = uVar21;
                      local_1848._8_4_ = uVar21;
                      local_1848._12_4_ = uVar21;
                      p_Stack_18d0 = auVar90._8_8_;
                      p_Stack_1890 = p_Stack_18d0;
                      local_1828 = context->user->instID[0];
                      local_1818 = context->user->instPrimID[0];
                      auVar8._4_4_ = fVar98 * fVar80;
                      auVar8._0_4_ = fVar95 * fVar79;
                      auVar8._8_4_ = fVar100 * fVar81;
                      auVar8._12_4_ = fVar48 * fVar49;
                      auVar44 = blendvps(_local_1978,auVar8,auVar59);
                      *(undefined1 (*) [16])(ray + 0x80) = auVar44;
                      args.valid = (int *)local_1988;
                      args.geometryUserPtr = pGVar4->userPtr;
                      args.context = context->user;
                      args.hit = (RTCHitN *)&local_1898;
                      args.N = 4;
                      pRVar18 = (RTCRayN *)pGVar4->occlusionFilterN;
                      local_1988 = auVar59;
                      args.ray = (RTCRayN *)ray;
                      local_1898 = auVar90._0_8_;
                      local_1888 = auVar82;
                      local_1878 = fVar142;
                      fStack_1874 = fVar144;
                      fStack_1870 = fVar146;
                      fStack_186c = fVar148;
                      local_1838 = uVar16;
                      uStack_1834 = uVar16;
                      uStack_1830 = uVar16;
                      uStack_182c = uVar16;
                      uStack_1824 = local_1828;
                      uStack_1820 = local_1828;
                      uStack_181c = local_1828;
                      uStack_1814 = local_1818;
                      uStack_1810 = local_1818;
                      uStack_180c = local_1818;
                      if (pRVar18 != (RTCRayN *)0x0) {
                        valid_i = (vint<4> *)&args;
                        pRVar18 = (RTCRayN *)(*(code *)pRVar18)();
                      }
                      if (local_1988 == (undefined1  [16])0x0) {
                        auVar69._8_4_ = 0xffffffff;
                        auVar69._0_8_ = 0xffffffffffffffff;
                        auVar69._12_4_ = 0xffffffff;
                        auVar69 = auVar69 ^ _DAT_01febe20;
                      }
                      else {
                        p_Var5 = context->args->filter;
                        if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                          valid_i = (vint<4> *)&args;
                          (*p_Var5)((RTCFilterFunctionNArguments *)valid_i);
                        }
                        auVar45._0_4_ = -(uint)(local_1988._0_4_ == 0);
                        auVar45._4_4_ = -(uint)(local_1988._4_4_ == 0);
                        auVar45._8_4_ = -(uint)(local_1988._8_4_ == 0);
                        auVar45._12_4_ = -(uint)(local_1988._12_4_ == 0);
                        auVar69 = auVar45 ^ _DAT_01febe20;
                        auVar44 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),
                                           auVar45);
                        *(undefined1 (*) [16])(args.ray + 0x80) = auVar44;
                        pRVar18 = args.ray;
                      }
                      uVar16 = (uint)pRVar18;
                      auVar71._0_4_ = auVar69._0_4_ << 0x1f;
                      auVar71._4_4_ = auVar69._4_4_ << 0x1f;
                      auVar71._8_4_ = auVar69._8_4_ << 0x1f;
                      auVar71._12_4_ = auVar69._12_4_ << 0x1f;
                      auVar59._0_4_ = auVar71._0_4_ >> 0x1f;
                      auVar59._4_4_ = auVar71._4_4_ >> 0x1f;
                      auVar59._8_4_ = auVar71._8_4_ >> 0x1f;
                      auVar59._12_4_ = auVar71._12_4_ >> 0x1f;
                      auVar44 = blendvps(_local_1978,*(undefined1 (*) [16])(ray + 0x80),auVar71);
                      *(undefined1 (*) [16])(ray + 0x80) = auVar44;
                    }
                    auVar54 = ~auVar59 & auVar54;
                  }
                }
              }
            }
          }
        }
        iVar20 = movmskps(uVar16,auVar54);
        uVar16 = CONCAT31((int3)((uint)iVar20 >> 8),iVar20 != 0);
      }
      fVar102 = INFINITY;
      fVar100 = INFINITY;
      fVar98 = INFINITY;
      fVar95 = INFINITY;
      uVar17 = (ulong)uVar16;
      if (((char)uVar16 == '\0') ||
         (uVar17 = uVar31 + 1, bVar33 = 2 < uVar31, uVar31 = uVar17, bVar33)) break;
    }
    auVar46._0_4_ = auVar41._0_4_ & auVar54._0_4_;
    auVar46._4_4_ = auVar41._4_4_ & auVar54._4_4_;
    auVar46._8_4_ = auVar41._8_4_ & auVar54._8_4_;
    auVar46._12_4_ = auVar41._12_4_ & auVar54._12_4_;
    iVar20 = movmskps((int)uVar17,auVar46);
    if (iVar20 == 0) break;
  }
  iVar20 = (int)uVar19;
  uVar25 = CONCAT44(auVar46._4_4_,auVar46._0_4_);
  aVar47._0_8_ = uVar25 ^ 0xffffffffffffffff;
  aVar47._8_4_ = auVar46._8_4_ ^ 0xffffffff;
  aVar47._12_4_ = auVar46._12_4_ ^ 0xffffffff;
LAB_0024804b:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       ((undefined1  [16])aVar47 | (undefined1  [16])terminated.field_0);
  iVar20 = movmskps(iVar20,(undefined1  [16])terminated.field_0);
  if (iVar20 == 0xf) {
LAB_00248080:
    iVar20 = 3;
  }
  else {
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                  (undefined1  [16])terminated.field_0);
    iVar20 = 0;
  }
LAB_00248083:
  paVar28 = paVar29;
  if (iVar20 == 3) {
    auVar60._4_4_ = uVar128 & terminated.field_0.i[1];
    auVar60._0_4_ = uVar122 & terminated.field_0.i[0];
    auVar60._8_4_ = auVar124._8_4_ & terminated.field_0.i[2];
    auVar60._12_4_ = auVar124._12_4_ & terminated.field_0.i[3];
    auVar60 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01feba00,auVar60);
    *(undefined1 (*) [16])(ray + 0x80) = auVar60;
    return;
  }
  goto LAB_00247181;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }